

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O1

String * __thiscall
Diligent::GetPipelineResourceFlagsString_abi_cxx11_
          (String *__return_storage_ptr__,Diligent *this,PIPELINE_RESOURCE_FLAGS Flags,
          bool GetFullName,char *DelimiterString)

{
  char *pcVar1;
  ulong uVar2;
  char *pcVar3;
  byte bVar4;
  byte bVar5;
  string msg;
  string local_50;
  
  if ((int)this == 0) {
    pcVar3 = "UNKNOWN";
    if (Flags != PIPELINE_RESOURCE_FLAG_NONE) {
      pcVar3 = "PIPELINE_RESOURCE_FLAG_NONE";
    }
    pcVar1 = pcVar3 + 7;
    if (Flags != PIPELINE_RESOURCE_FLAG_NONE) {
      pcVar1 = pcVar3 + 0x1b;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar1);
  }
  else {
    uVar2 = (ulong)this & 0xffffffff;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    do {
      if (__return_storage_ptr__->_M_string_length != 0) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      bVar4 = (byte)uVar2;
      bVar5 = -bVar4 & bVar4;
      switch(bVar5) {
      case 1:
        break;
      case 2:
        break;
      case 3:
      case 5:
      case 6:
      case 7:
switchD_00512cd6_caseD_3:
        FormatString<char[34]>(&local_50,(char (*) [34])"Unexpected pipeline resource flag");
        DebugAssertionFailed
                  (local_50._M_dataplus._M_p,"GetPipelineResourceFlagsString",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                   ,0x680);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        goto LAB_00512d4b;
      case 4:
        break;
      case 8:
        break;
      default:
        if (bVar5 != 0x10) goto switchD_00512cd6_caseD_3;
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_00512d4b:
      uVar2 = (ulong)(bVar5 ^ bVar4);
    } while (bVar5 != bVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

String GetPipelineResourceFlagsString(PIPELINE_RESOURCE_FLAGS Flags, bool GetFullName /*= false*/, const char* DelimiterString /*= "|"*/)
{
    if (Flags == PIPELINE_RESOURCE_FLAG_NONE)
        return GetFullName ? "PIPELINE_RESOURCE_FLAG_NONE" : "UNKNOWN";
    String Str;
    while (Flags != PIPELINE_RESOURCE_FLAG_NONE)
    {
        if (!Str.empty())
            Str += DelimiterString;

        PIPELINE_RESOURCE_FLAGS Flag = ExtractLSB(Flags);

        static_assert(PIPELINE_RESOURCE_FLAG_LAST == (1u << 4), "Please update the switch below to handle the new pipeline resource flag.");
        switch (Flag)
        {
            case PIPELINE_RESOURCE_FLAG_NO_DYNAMIC_BUFFERS:
                Str.append(GetFullName ? "PIPELINE_RESOURCE_FLAG_NO_DYNAMIC_BUFFERS" : "NO_DYNAMIC_BUFFERS");
                break;

            case PIPELINE_RESOURCE_FLAG_COMBINED_SAMPLER:
                Str.append(GetFullName ? "PIPELINE_RESOURCE_FLAG_COMBINED_SAMPLER" : "COMBINED_SAMPLER");
                break;

            case PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER:
                Str.append(GetFullName ? "PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER" : "FORMATTED_BUFFER");
                break;

            case PIPELINE_RESOURCE_FLAG_RUNTIME_ARRAY:
                Str.append(GetFullName ? "PIPELINE_RESOURCE_FLAG_RUNTIME_ARRAY" : "RUNTIME_ARRAY");
                break;

            case PIPELINE_RESOURCE_FLAG_GENERAL_INPUT_ATTACHMENT:
                Str.append(GetFullName ? "PIPELINE_RESOURCE_FLAG_GENERAL_INPUT_ATTACHMENT" : "GENERAL_INPUT_ATTACHMENT");
                break;

            default:
                UNEXPECTED("Unexpected pipeline resource flag");
        }
    }
    return Str;
}